

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O3

string * __thiscall
pbrt::SampledSpectrum::ToString_abi_cxx11_(string *__return_storage_ptr__,SampledSpectrum *this)

{
  long lVar1;
  string ret;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"[ ","");
  lVar1 = 0;
  do {
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    detail::stringPrintfRecursive<float_const&>
              (&local_50,"%f",(float *)((long)(this->values).values + lVar1));
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                               local_50.field_2._M_local_buf[0]) + 1);
    }
    if (lVar1 == 0xc) break;
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x10);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string SampledSpectrum::ToString() const {
    std::string str = "[ ";
    for (int i = 0; i < NSpectrumSamples; ++i) {
        str += StringPrintf("%f", values[i]);
        if (i + 1 < NSpectrumSamples)
            str += ", ";
    }
    str += " ]";
    return str;
}